

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_NV_fragment_program(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_NV_fragment_program != 0) {
    glad_glProgramNamedParameter4fNV =
         (PFNGLPROGRAMNAMEDPARAMETER4FNVPROC)(*load)("glProgramNamedParameter4fNV");
    glad_glProgramNamedParameter4fvNV =
         (PFNGLPROGRAMNAMEDPARAMETER4FVNVPROC)(*load)("glProgramNamedParameter4fvNV");
    glad_glProgramNamedParameter4dNV =
         (PFNGLPROGRAMNAMEDPARAMETER4DNVPROC)(*load)("glProgramNamedParameter4dNV");
    glad_glProgramNamedParameter4dvNV =
         (PFNGLPROGRAMNAMEDPARAMETER4DVNVPROC)(*load)("glProgramNamedParameter4dvNV");
    glad_glGetProgramNamedParameterfvNV =
         (PFNGLGETPROGRAMNAMEDPARAMETERFVNVPROC)(*load)("glGetProgramNamedParameterfvNV");
    glad_glGetProgramNamedParameterdvNV =
         (PFNGLGETPROGRAMNAMEDPARAMETERDVNVPROC)(*load)("glGetProgramNamedParameterdvNV");
  }
  return;
}

Assistant:

static void load_GL_NV_fragment_program(GLADloadproc load) {
	if(!GLAD_GL_NV_fragment_program) return;
	glad_glProgramNamedParameter4fNV = (PFNGLPROGRAMNAMEDPARAMETER4FNVPROC)load("glProgramNamedParameter4fNV");
	glad_glProgramNamedParameter4fvNV = (PFNGLPROGRAMNAMEDPARAMETER4FVNVPROC)load("glProgramNamedParameter4fvNV");
	glad_glProgramNamedParameter4dNV = (PFNGLPROGRAMNAMEDPARAMETER4DNVPROC)load("glProgramNamedParameter4dNV");
	glad_glProgramNamedParameter4dvNV = (PFNGLPROGRAMNAMEDPARAMETER4DVNVPROC)load("glProgramNamedParameter4dvNV");
	glad_glGetProgramNamedParameterfvNV = (PFNGLGETPROGRAMNAMEDPARAMETERFVNVPROC)load("glGetProgramNamedParameterfvNV");
	glad_glGetProgramNamedParameterdvNV = (PFNGLGETPROGRAMNAMEDPARAMETERDVNVPROC)load("glGetProgramNamedParameterdvNV");
}